

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O1

int set_strap_from_string(char *strap_s)

{
  ulong uVar1;
  int iVar2;
  char *end_ptr;
  char *local_10;
  
  iVar2 = 1;
  if (strap_s != (char *)0x0) {
    uVar1 = strtoul(strap_s,&local_10,0x10);
    if (uVar1 == 0xffffffffffffffff) {
      set_strap_from_string_cold_1();
    }
    else {
      strap = (uint32_t)uVar1;
      iVar2 = 0;
      printf("Strap set to 0x%x\n",uVar1 & 0xffffffff);
    }
  }
  return iVar2;
}

Assistant:

int set_strap_from_string(const char* strap_s)
{
	char* end_ptr;
	unsigned long int value;

	if (strap_s != NULL) {
		value = strtoul(strap_s, &end_ptr, 16);
		if (value != ULONG_MAX) {
			strap = value;
			printf("Strap set to 0x%x\n", strap);
			return 0;
		}

		fprintf(stderr, "Invalid strap value!\n");
	}

	return 1;
}